

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

void uv__fs_work(uv__work *w)

{
  bool bVar1;
  int iVar2;
  void **req_00;
  int *piVar3;
  bool bVar4;
  void *local_28;
  ssize_t r;
  uv_fs_t *req;
  int retry_on_eintr;
  uv__work *w_local;
  
  req_00 = w[-9].wq;
  bVar4 = true;
  if (*(int *)&w[-7].done != 2) {
    bVar4 = *(int *)&w[-7].done == 3;
  }
  do {
    piVar3 = __errno_location();
    *piVar3 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      local_28 = (void *)uv__fs_open((uv_fs_t *)req_00);
      break;
    case 2:
      iVar2 = close(*(int *)w[-2].wq);
      local_28 = (void *)(long)iVar2;
      break;
    case 3:
      local_28 = (void *)uv__fs_read((uv_fs_t *)req_00);
      break;
    case 4:
      local_28 = (void *)uv__fs_write_all((uv_fs_t *)req_00);
      break;
    case 5:
      local_28 = (void *)uv__fs_sendfile((uv_fs_t *)req_00);
      break;
    case 6:
      iVar2 = uv__fs_stat((char *)w[-6].done,(uv_stat_t *)&w[-6].loop);
      local_28 = (void *)(long)iVar2;
      break;
    case 7:
      iVar2 = uv__fs_lstat((char *)w[-6].done,(uv_stat_t *)&w[-6].loop);
      local_28 = (void *)(long)iVar2;
      break;
    case 8:
      iVar2 = uv__fs_fstat(*(int *)w[-2].wq,(uv_stat_t *)&w[-6].loop);
      local_28 = (void *)(long)iVar2;
      break;
    case 9:
      iVar2 = ftruncate(*(int *)w[-2].wq,(__off_t)w[-1].done);
      local_28 = (void *)(long)iVar2;
      break;
    case 10:
      local_28 = (void *)uv__fs_utime((uv_fs_t *)req_00);
      break;
    case 0xb:
      local_28 = (void *)uv__fs_futime((uv_fs_t *)req_00);
      break;
    case 0xc:
      iVar2 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      local_28 = (void *)(long)iVar2;
      break;
    case 0xd:
      iVar2 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      local_28 = (void *)(long)iVar2;
      break;
    case 0xe:
      iVar2 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      local_28 = (void *)(long)iVar2;
      break;
    case 0xf:
      local_28 = (void *)uv__fs_fsync((uv_fs_t *)req_00);
      break;
    case 0x10:
      local_28 = (void *)uv__fs_fdatasync((uv_fs_t *)req_00);
      break;
    case 0x11:
      iVar2 = unlink((char *)w[-6].done);
      local_28 = (void *)(long)iVar2;
      break;
    case 0x12:
      iVar2 = rmdir((char *)w[-6].done);
      local_28 = (void *)(long)iVar2;
      break;
    case 0x13:
      iVar2 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      local_28 = (void *)(long)iVar2;
      break;
    case 0x14:
      local_28 = (void *)uv__fs_mkdtemp((uv_fs_t *)req_00);
      break;
    case 0x15:
      iVar2 = rename((char *)w[-6].done,(char *)w[-2].loop);
      local_28 = (void *)(long)iVar2;
      break;
    case 0x16:
      local_28 = (void *)uv__fs_scandir((uv_fs_t *)req_00);
      break;
    case 0x17:
      iVar2 = link((char *)w[-6].done,(char *)w[-2].loop);
      local_28 = (void *)(long)iVar2;
      break;
    case 0x18:
      iVar2 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      local_28 = (void *)(long)iVar2;
      break;
    case 0x19:
      local_28 = (void *)uv__fs_readlink((uv_fs_t *)req_00);
      break;
    case 0x1a:
      iVar2 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      local_28 = (void *)(long)iVar2;
      break;
    case 0x1b:
      iVar2 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      local_28 = (void *)(long)iVar2;
      break;
    case 0x1c:
      local_28 = (void *)uv__fs_realpath((uv_fs_t *)req_00);
      break;
    case 0x1d:
      local_28 = (void *)uv__fs_copyfile((uv_fs_t *)req_00);
      break;
    case 0x1e:
      iVar2 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      local_28 = (void *)(long)iVar2;
      break;
    default:
      abort();
    }
    bVar1 = false;
    if (local_28 == (void *)0xffffffffffffffff) {
      piVar3 = __errno_location();
      bVar1 = false;
      if (*piVar3 == 4) {
        bVar1 = (bool)(bVar4 ^ 1);
      }
    }
  } while (bVar1);
  if (local_28 == (void *)0xffffffffffffffff) {
    piVar3 = __errno_location();
    w[-7].wq[1] = (void *)(long)-*piVar3;
  }
  else {
    w[-7].wq[1] = local_28;
  }
  if ((local_28 == (void *)0x0) &&
     (((*(int *)&w[-7].done == 6 || (*(int *)&w[-7].done == 8)) || (*(int *)&w[-7].done == 7)))) {
    w[-6].work = (_func_void_uv__work_ptr *)&w[-6].loop;
  }
  return;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}